

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cmprintf(cm_printf_type type,size_t test_number,char *test_name,char *error_message)

{
  cm_message_output cVar1;
  char *error_message_00;
  char *in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  cm_message_output output;
  undefined4 in_stack_ffffffffffffffd8;
  cm_printf_type type_00;
  
  cVar1 = cm_get_output();
  error_message_00 = (char *)(ulong)cVar1;
  type_00 = (cm_printf_type)((ulong)in_RCX >> 0x20);
  switch(error_message_00) {
  case (char *)0x0:
    cmprintf_standard(type_00,(char *)CONCAT44(cVar1,in_stack_ffffffffffffffd8),error_message_00);
    break;
  case (char *)0x1:
    cmprintf_subunit(type_00,(char *)CONCAT44(cVar1,in_stack_ffffffffffffffd8),error_message_00);
    break;
  case (char *)0x2:
    cmprintf_tap((cm_printf_type)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI,in_RDX,in_RCX);
    break;
  case (char *)0x3:
  }
  return;
}

Assistant:

static void cmprintf(enum cm_printf_type type,
                     size_t test_number,
                     const char *test_name,
                     const char *error_message)
{
    enum cm_message_output output;

    output = cm_get_output();

    switch (output) {
    case CM_OUTPUT_STDOUT:
        cmprintf_standard(type, test_name, error_message);
        break;
    case CM_OUTPUT_SUBUNIT:
        cmprintf_subunit(type, test_name, error_message);
        break;
    case CM_OUTPUT_TAP:
        cmprintf_tap(type, test_number, test_name, error_message);
        break;
    case CM_OUTPUT_XML:
        break;
    }
}